

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O1

RPCHelpMan * getrawtransaction(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *plVar4;
  string name;
  string name_00;
  string name_01;
  string cond;
  string m_key_name;
  string cond_00;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string cond_01;
  string name_02;
  string m_key_name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string m_key_name_09;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string m_key_name_10;
  string description_15;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_16;
  string description_17;
  string description_18;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  RPCExamples examples;
  string description_19;
  string description_20;
  string description_21;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  undefined8 uVar16;
  RPCHelpMan *in_RDI;
  RPCResult *arg;
  pointer pRVar17;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffe3e8;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffe3ec;
  undefined1 in_stack_ffffffffffffe3f0 [16];
  undefined1 in_stack_ffffffffffffe408 [24];
  undefined8 in_stack_ffffffffffffe420;
  RPCResult *pRVar19;
  undefined8 in_stack_ffffffffffffe428;
  undefined8 in_stack_ffffffffffffe430;
  pointer in_stack_ffffffffffffe438;
  code *pcVar20;
  undefined8 in_stack_ffffffffffffe440;
  undefined1 in_stack_ffffffffffffe448 [16];
  pointer in_stack_ffffffffffffe458;
  pointer in_stack_ffffffffffffe460;
  pointer in_stack_ffffffffffffe468;
  pointer in_stack_ffffffffffffe470;
  pointer pRVar21;
  pointer in_stack_ffffffffffffe478;
  undefined8 in_stack_ffffffffffffe480;
  pointer in_stack_ffffffffffffe488;
  pointer in_stack_ffffffffffffe490;
  pointer in_stack_ffffffffffffe498;
  undefined8 in_stack_ffffffffffffe4a0;
  pointer in_stack_ffffffffffffe4a8;
  pointer in_stack_ffffffffffffe4b0;
  pointer in_stack_ffffffffffffe4b8;
  undefined1 in_stack_ffffffffffffe4c0 [16];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1af0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ad8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ab8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1aa0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a88;
  allocator_type local_1a69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1988;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1968;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1950;
  allocator_type local_1935;
  int local_1934;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1930;
  string local_1918;
  string local_18f8;
  string local_18d8;
  string local_18b8;
  string local_1898;
  string local_1878;
  string local_1858;
  string local_1838;
  string local_1818;
  string local_17f8;
  string local_17d8;
  string local_17b8;
  string local_1798;
  string local_1778;
  string local_1758;
  string local_1738;
  string local_1718;
  string local_16f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  ulong *local_1658;
  undefined8 local_1650;
  ulong local_1648;
  undefined8 uStack_1640;
  ulong *local_1638;
  size_type local_1630;
  ulong local_1628;
  undefined8 uStack_1620;
  long *local_1618 [2];
  long local_1608 [2];
  long *local_15f8 [2];
  long local_15e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d8;
  long *local_15b8 [2];
  long local_15a8 [2];
  long *local_1598 [2];
  long local_1588 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1578;
  long *local_1558 [2];
  long local_1548 [2];
  pointer local_1538 [2];
  undefined1 local_1528 [152];
  RPCResult local_1490;
  RPCResult local_1408;
  RPCResult local_1380;
  long *local_12f8 [2];
  long local_12e8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_12d8;
  long *local_12b8 [2];
  long local_12a8 [2];
  pointer local_1298 [2];
  undefined1 local_1288 [152];
  RPCResult local_11f0;
  long *local_1168 [2];
  long local_1158 [2];
  long *local_1148 [2];
  long local_1138 [2];
  RPCResult local_1128;
  long *local_10a0 [2];
  long local_1090 [2];
  long *local_1080 [2];
  long local_1070 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  size_type *local_1040;
  size_type local_1038;
  size_type local_1030 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1020;
  long *local_1000 [2];
  long local_ff0 [2];
  pointer local_fe0 [2];
  undefined1 local_fd0 [152];
  RPCResult local_f38;
  RPCResult local_eb0;
  long *local_e28 [2];
  long local_e18 [2];
  long *local_e08 [2];
  long local_df8 [2];
  long *local_de8 [2];
  long local_dd8 [2];
  string local_dc8;
  long *local_da8 [2];
  long local_d98 [2];
  long *local_d88 [2];
  long local_d78 [2];
  long *local_d68 [2];
  long local_d58 [2];
  long *local_d48 [2];
  long local_d38 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  long *local_d08 [2];
  long local_cf8 [2];
  long *local_ce8 [2];
  long local_cd8 [2];
  long *local_cc8 [2];
  long local_cb8 [2];
  long *local_ca8 [2];
  long local_c98 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_c88;
  long *local_c68 [2];
  long local_c58 [2];
  pointer local_c48 [2];
  undefined1 local_c38 [152];
  RPCResult local_ba0;
  RPCResult local_b18;
  RPCResult local_a90;
  RPCResult local_a08;
  RPCResult local_980;
  long *local_8f8 [2];
  long local_8e8 [2];
  long *local_8d8 [2];
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_898;
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  RPCResult local_838;
  RPCResult local_7b0;
  RPCResult local_728;
  undefined1 local_6a0;
  undefined1 *local_698;
  undefined8 local_690;
  undefined1 local_688;
  undefined7 uStack_687;
  undefined1 local_678 [32];
  long *local_658 [2];
  long local_648 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_638;
  undefined1 local_5e0;
  long *local_5d8 [2];
  long local_5c8 [2];
  undefined1 local_5b8;
  undefined1 *local_5b0;
  undefined8 local_5a8;
  undefined1 local_5a0;
  undefined7 uStack_59f;
  undefined1 local_590 [32];
  long *local_570 [2];
  long local_560 [2];
  UniValue local_550;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getrawtransaction","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "By default, this call only returns a transaction if it is in the mempool. If -txindex is enabled\nand no blockhash argument is passed, it will return the transaction if it is in the mempool or any block.\nIf a blockhash argument is passed, it will return the transaction if\nthe specified block is available and the transaction is in that block.\n\nHint: Use gettransaction for wallet transactions.\n\nIf verbosity is 0 or omitted, returns the serialized transaction as a hex-encoded string.\nIf verbosity is 1, returns a JSON Object with information about the transaction.\nIf verbosity is 2, returns a JSON Object with information about the transaction, including fee and prevout information."
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"txid","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"The transaction id","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe3e8;
  name._8_16_ = in_stack_ffffffffffffe3f0;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe420;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_24_ = in_stack_ffffffffffffe408;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe428;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe430;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe438;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe440;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffe448;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe458;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe460;
  description_19._M_string_length = (size_type)in_stack_ffffffffffffe470;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe468;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe478;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe480;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe490;
  opts._0_8_ = in_stack_ffffffffffffe488;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe498;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe4a0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe4a8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe4b0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe4b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe4c0._0_8_;
  opts.hidden = (bool)in_stack_ffffffffffffe4c0[8];
  opts.also_positional = (bool)in_stack_ffffffffffffe4c0[9];
  opts._66_6_ = in_stack_ffffffffffffe4c0._10_6_;
  RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_19,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"verbosity|verbose","");
  local_1934 = 0;
  UniValue::UniValue<int,_int,_true>(&local_550,&local_1934);
  paVar14 = &local_550.val.field_2;
  local_4f8._8_8_ = (long)&local_4f8 + 0x18;
  local_4f8._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_550.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.val._M_dataplus._M_p == paVar14) {
    local_4f8._32_8_ = local_550.val.field_2._8_8_;
  }
  else {
    local_4f8._8_8_ = local_550.val._M_dataplus._M_p;
  }
  local_4f8._16_8_ = local_550.val._M_string_length;
  local_550.val._M_string_length = 0;
  local_550.val.field_2._M_local_buf[0] = '\0';
  local_4f8._40_8_ =
       local_550.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4f8._48_8_ =
       local_550.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4f8._56_8_ =
       local_550.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_550.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_550.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_550.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8._64_4_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_4f8._68_4_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_4f8._72_4_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_4f8._76_4_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_4f8._80_8_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a0 = 2;
  local_570[0] = local_560;
  local_550.val._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_570,
             "0 for hex-encoded data, 1 for a JSON object, and 2 for JSON object with fee and prevout"
             ,"");
  local_5b0 = &local_5a0;
  local_5b8 = 1;
  local_5a8 = 0;
  local_5a0 = 0;
  local_590._0_8_ = (pointer)0x0;
  local_590._8_2_ = 0;
  local_590._10_6_ = 0;
  local_590._16_2_ = 0;
  local_590._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe3e8;
  name_00._8_16_ = in_stack_ffffffffffffe3f0;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe420;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_24_ = in_stack_ffffffffffffe408;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe428;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe430;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe438;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe440;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffe448;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe458;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe460;
  description_20._M_string_length = (size_type)in_stack_ffffffffffffe470;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe468;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe478;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe480;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe490;
  opts_00._0_8_ = in_stack_ffffffffffffe488;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe498;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe4a0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe4a8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe4b0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe4b8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe4c0._0_8_;
  opts_00.hidden = (bool)in_stack_ffffffffffffe4c0[8];
  opts_00.also_positional = (bool)in_stack_ffffffffffffe4c0[9];
  opts_00._66_6_ = in_stack_ffffffffffffe4c0._10_6_;
  RPCArg::RPCArg(&local_288,name_00,(Type)local_498,fallback_00,description_20,opts_00);
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"blockhash","");
  local_638._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_5e0 = 0;
  local_658[0] = local_648;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_658,"The block in which to look for the transaction","");
  local_698 = &local_688;
  local_6a0 = 0;
  local_690 = 0;
  local_688 = 0;
  local_678._0_8_ = (pointer)0x0;
  local_678._8_2_ = 0;
  local_678._10_6_ = 0;
  local_678._16_2_ = 0;
  local_678._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe3e8;
  name_01._8_16_ = in_stack_ffffffffffffe3f0;
  name_01.field_2._8_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe420;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_24_ = in_stack_ffffffffffffe408;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe428;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe430;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe438;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe440;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffe448;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe458;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe460;
  description_21._M_string_length = (size_type)in_stack_ffffffffffffe470;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe468;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe478;
  description_21.field_2._8_8_ = in_stack_ffffffffffffe480;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe490;
  opts_01._0_8_ = in_stack_ffffffffffffe488;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe498;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe4a0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe4a8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe4b0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe4b8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe4c0._0_8_;
  opts_01.hidden = (bool)in_stack_ffffffffffffe4c0[8];
  opts_01.also_positional = (bool)in_stack_ffffffffffffe4c0[9];
  opts_01._66_6_ = in_stack_ffffffffffffe4c0._10_6_;
  RPCArg::RPCArg(&local_180,name_01,(Type)local_5d8,fallback_01,description_21,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1930,__l,&local_1935);
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_858,"if verbosity is not set or set to 0","");
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"data","");
  local_898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_898,"The serialized transaction as a hex-encoded string for \'txid\'",
             "");
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  cond._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe3e8;
  cond._8_16_ = in_stack_ffffffffffffe3f0;
  cond.field_2._8_8_ = in_RDI;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe420;
  m_key_name_08._0_24_ = in_stack_ffffffffffffe408;
  description_16._M_string_length = in_stack_ffffffffffffe430;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe428;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe438;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe440;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe458;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe448._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe448._8_8_;
  RPCResult::RPCResult(&local_838,cond,(Type)local_858,m_key_name_08,description_16,inner_15);
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"if verbosity is set to 1","")
  ;
  local_8d8[0] = local_8c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"");
  local_8f8[0] = local_8e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"");
  local_c48[0] = (pointer)local_c38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"in_active_chain","");
  local_c68[0] = local_c58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c68,
             "Whether specified block is in the active chain or not (only present with explicit \"blockhash\" argument)"
             ,"");
  local_19c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_16_ = in_stack_ffffffffffffe3f0;
  auVar5._0_4_ = in_stack_ffffffffffffe3ec;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description.field_2._8_8_ = in_stack_ffffffffffffe420;
  description._0_24_ = in_stack_ffffffffffffe408;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe430;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe428;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            ((RPCResult *)(local_c38 + 0x10),BOOL,(string)(auVar5 << 0x20),SUB81(local_c48,0),
             description,inner,true);
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"blockhash","");
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"the block hash","");
  local_19e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_16_ = in_stack_ffffffffffffe3f0;
  auVar6._0_4_ = in_stack_ffffffffffffe3ec;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_00._0_24_ = in_stack_ffffffffffffe408;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_ba0,STR_HEX,(string)(auVar6 << 0x20),SUB81(&local_c88,0),description_00,inner_00
             ,true);
  local_cc8[0] = local_cb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"confirmations","");
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"The confirmations","");
  local_1a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar7._4_16_ = in_stack_ffffffffffffe3f0;
  auVar7._0_4_ = in_stack_ffffffffffffe3ec;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_01._0_24_ = in_stack_ffffffffffffe408;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_b18,NUM,(string)(auVar7 << 0x20),SUB81(local_cc8,0),description_01,inner_01,true
            );
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"blocktime","");
  std::operator+(&local_d28,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8._4_16_ = in_stack_ffffffffffffe3f0;
  auVar8._0_4_ = in_stack_ffffffffffffe3ec;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_02._0_24_ = in_stack_ffffffffffffe408;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_a90,NUM_TIME,(string)(auVar8 << 0x20),SUB81(local_d08,0),description_02,inner_02
             ,true);
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"time","");
  local_d68[0] = local_d58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d68,"Same as \"blocktime\"","");
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar9._4_16_ = in_stack_ffffffffffffe3f0;
  auVar9._0_4_ = in_stack_ffffffffffffe3ec;
  auVar9._20_8_ = in_RDI;
  auVar9._28_4_ = 0;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_03._0_24_ = in_stack_ffffffffffffe408;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_a08,NUM,(string)(auVar9 << 0x20),SUB81(local_d48,0),description_03,inner_03,true
            );
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"hex","");
  local_da8[0] = local_d98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da8,"The serialized, hex-encoded data for \'txid\'","");
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name.field_2._8_8_ = in_RDI;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_04._0_24_ = in_stack_ffffffffffffe408;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult(&local_980,STR_HEX,m_key_name,description_04,inner_04,SUB81(local_d88,0));
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)(local_c38 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_19a8,__l_00,&local_1a69);
  local_dc8._M_dataplus._M_p = (pointer)&local_dc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_dc8,"The transaction id (same as provided)","");
  DecodeTxDoc(&local_1a88,&local_dc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_19a8,
             ((long)local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f +
             ((long)local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  if (local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar17 = local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_19a8,pRVar17);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 !=
             local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  cond_00._M_dataplus._M_p._0_4_ = uVar18;
  cond_00._8_16_ = in_stack_ffffffffffffe3f0;
  cond_00.field_2._8_8_ = in_RDI;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe420;
  m_key_name_09._0_24_ = in_stack_ffffffffffffe408;
  description_17._M_string_length = in_stack_ffffffffffffe430;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe428;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe438;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe440;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe458;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe448._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe448._8_8_;
  RPCResult::RPCResult(&local_7b0,cond_00,(Type)local_8b8,m_key_name_09,description_17,inner_16);
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_de8,"for verbosity = 2","");
  local_e08[0] = local_df8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"");
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,"");
  local_fe0[0] = (pointer)local_fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"");
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1000,"Same output as verbosity = 1","");
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_05._0_24_ = in_stack_ffffffffffffe408;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            ((RPCResult *)(local_fd0 + 0x10),ELISION,m_key_name_00,description_05,inner_05,
             SUB81(local_fe0,0));
  local_1020.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1020.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1020,"fee","");
  std::operator+(&local_1060,"transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1060,", omitted if block undo data is not available");
  local_1040 = local_1030;
  psVar1 = (size_type *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_1030[0] = paVar14->_M_allocated_capacity;
    local_1030[1] = *(undefined8 *)((long)&pbVar12->field_2 + 8);
  }
  else {
    local_1030[0] = paVar14->_M_allocated_capacity;
    local_1040 = psVar1;
  }
  local_1038 = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar18 = 0;
  auVar10._4_16_ = in_stack_ffffffffffffe3f0;
  auVar10._0_4_ = in_stack_ffffffffffffe3ec;
  auVar10._20_8_ = in_RDI;
  auVar10._28_4_ = 0;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_06._0_24_ = in_stack_ffffffffffffe408;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_f38,NUM,(string)(auVar10 << 0x20),SUB81(&local_1020,0),description_06,inner_06,
             true);
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1080,"vin","");
  local_10a0[0] = local_1090;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a0,"");
  local_1148[0] = local_1138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1148,"");
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"utxo being spent","");
  local_1298[0] = (pointer)local_1288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1298,"");
  local_12b8[0] = local_12a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12b8,"Same output as verbosity = 1","");
  local_1b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe420;
  description_07._0_24_ = in_stack_ffffffffffffe408;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            ((RPCResult *)(local_1288 + 0x10),ELISION,m_key_name_01,description_07,inner_07,
             SUB81(local_1298,0));
  pRVar19 = &local_11f0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d8,"prevout","");
  local_12f8[0] = local_12e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12f8,"The previous output, omitted if block undo data is not available"
             ,"");
  local_1538[0] = (pointer)local_1528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1538,"generated","");
  local_1558[0] = local_1548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"Coinbase or not","");
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_08.field_2._8_8_ = pRVar19;
  description_08._0_24_ = in_stack_ffffffffffffe408;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            ((RPCResult *)(local_1528 + 0x10),BOOL,m_key_name_02,description_08,inner_08,
             SUB81(local_1538,0));
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1578,"height","");
  local_1598[0] = local_1588;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1598,"The height of the prevout","");
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_09.field_2._8_8_ = pRVar19;
  description_09._0_24_ = in_stack_ffffffffffffe408;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult(&local_1490,NUM,m_key_name_03,description_09,inner_09,SUB81(&local_1578,0));
  local_15b8[0] = local_15a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15b8,"value","");
  std::operator+(&local_15d8,"The value in ",&CURRENCY_UNIT_abi_cxx11_);
  pRVar17 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_10.field_2._8_8_ = pRVar19;
  description_10._0_24_ = in_stack_ffffffffffffe408;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_1408,STR_AMOUNT,m_key_name_04,description_10,inner_10,SUB81(local_15b8,0));
  local_15f8[0] = local_15e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15f8,"scriptPubKey","");
  local_1618[0] = local_1608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1618);
  ScriptPubKeyDoc();
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_11.field_2._8_8_ = pRVar19;
  description_11._0_24_ = in_stack_ffffffffffffe408;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult(&local_1380,OBJ,m_key_name_05,description_11,inner_11,SUB81(local_15f8,0));
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)(local_1528 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe4c0,__l_01,
             (allocator_type *)&stack0xffffffffffffe44f);
  uVar18 = 0;
  auVar11._4_16_ = in_stack_ffffffffffffe3f0;
  auVar11._0_4_ = in_stack_ffffffffffffe3ec;
  auVar11._20_8_ = in_RDI;
  auVar11._28_4_ = 0;
  description_12.field_2._8_8_ = pRVar19;
  description_12._0_24_ = in_stack_ffffffffffffe408;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult
            (&local_11f0,OBJ,(string)(auVar11 << 0x20),SUB81(&local_12d8,0),description_12,inner_12,
             true);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)(local_1288 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1b08,__l_02,(allocator_type *)&stack0xffffffffffffe44e);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_13.field_2._8_8_ = pRVar19;
  description_13._0_24_ = in_stack_ffffffffffffe408;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult(&local_1128,OBJ,m_key_name_06,description_13,inner_13,SUB81(local_1148,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_1128;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1af0,__l_03,(allocator_type *)&stack0xffffffffffffe44d);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe3f0;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_14.field_2._8_8_ = pRVar19;
  description_14._0_24_ = in_stack_ffffffffffffe408;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe430;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe428;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe438;
  RPCResult::RPCResult(&local_eb0,ARR,m_key_name_07,description_14,inner_14,SUB81(local_1080,0));
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)(local_fd0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1aa0,__l_04,(allocator_type *)&stack0xffffffffffffe44c);
  cond_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe3ec;
  cond_01._M_dataplus._M_p._0_4_ = uVar18;
  cond_01._8_16_ = in_stack_ffffffffffffe3f0;
  cond_01.field_2._8_8_ = in_RDI;
  m_key_name_10.field_2._8_8_ = pRVar19;
  m_key_name_10._0_24_ = in_stack_ffffffffffffe408;
  description_18._M_string_length = in_stack_ffffffffffffe430;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe428;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe438;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe440;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe458;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe448._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe448._8_8_;
  RPCResult::RPCResult(&local_728,cond_01,(Type)local_de8,m_key_name_10,description_18,inner_17);
  __l_05._M_len = 3;
  __l_05._M_array = &local_838;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1950,__l_05,(allocator_type *)&local_1678);
  local_1718._M_dataplus._M_p = (pointer)&local_1718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1718,"getrawtransaction","");
  local_1738._M_dataplus._M_p = (pointer)&local_1738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1738,"\"mytxid\"","");
  HelpExampleCli(&local_16f8,&local_1718,&local_1738);
  local_1778._M_dataplus._M_p = (pointer)&local_1778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1778,"getrawtransaction","");
  local_1798._M_dataplus._M_p = (pointer)&local_1798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1798,"\"mytxid\" 1","");
  HelpExampleCli(&local_1758,&local_1778,&local_1798);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
    uVar16 = local_16f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_1758._M_string_length + local_16f8._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
      uVar16 = local_1758.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1758._M_string_length + local_16f8._M_string_length)
    goto LAB_003783f0;
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1758,0,0,local_16f8._M_dataplus._M_p,local_16f8._M_string_length);
  }
  else {
LAB_003783f0:
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_16f8,local_1758._M_dataplus._M_p,local_1758._M_string_length);
  }
  local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if (paVar2 == paVar14) {
    local_16d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_16d8.field_2._8_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 8);
    local_16d8.field_2._12_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 0xc);
  }
  else {
    local_16d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_16d8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_16d8._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_17d8._M_dataplus._M_p = (pointer)&local_17d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17d8,"getrawtransaction","");
  local_17f8._M_dataplus._M_p = (pointer)&local_17f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17f8,"\"mytxid\", 1","");
  HelpExampleRpc(&local_17b8,&local_17d8,&local_17f8);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
    uVar16 = local_16d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_17b8._M_string_length + local_16d8._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_17b8._M_dataplus._M_p != &local_17b8.field_2) {
      uVar16 = local_17b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_17b8._M_string_length + local_16d8._M_string_length)
    goto LAB_00378529;
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_17b8,0,0,local_16d8._M_dataplus._M_p,local_16d8._M_string_length);
  }
  else {
LAB_00378529:
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_16d8,local_17b8._M_dataplus._M_p,local_17b8._M_string_length);
  }
  local_16b8._M_dataplus._M_p = (pointer)&local_16b8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if (paVar2 == paVar14) {
    local_16b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_16b8.field_2._8_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 8);
    local_16b8.field_2._12_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 0xc);
  }
  else {
    local_16b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_16b8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_16b8._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_1838._M_dataplus._M_p = (pointer)&local_1838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1838,"getrawtransaction","");
  local_1858._M_dataplus._M_p = (pointer)&local_1858.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1858,"\"mytxid\" 0 \"myblockhash\"","");
  HelpExampleCli(&local_1818,&local_1838,&local_1858);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
    uVar16 = local_16b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_1818._M_string_length + local_16b8._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1818._M_dataplus._M_p != &local_1818.field_2) {
      uVar16 = local_1818.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1818._M_string_length + local_16b8._M_string_length)
    goto LAB_00378662;
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1818,0,0,local_16b8._M_dataplus._M_p,local_16b8._M_string_length);
  }
  else {
LAB_00378662:
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_16b8,local_1818._M_dataplus._M_p,local_1818._M_string_length);
  }
  local_1698._M_dataplus._M_p = (pointer)&local_1698.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if (paVar2 == paVar14) {
    local_1698.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1698.field_2._8_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 8);
    local_1698.field_2._12_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 0xc);
  }
  else {
    local_1698.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1698._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1698._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_1898._M_dataplus._M_p = (pointer)&local_1898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1898,"getrawtransaction","");
  local_18b8._M_dataplus._M_p = (pointer)&local_18b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_18b8,"\"mytxid\" 1 \"myblockhash\"","");
  HelpExampleCli(&local_1878,&local_1898,&local_18b8);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
    uVar16 = local_1698.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_1878._M_string_length + local_1698._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
      uVar16 = local_1878.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1878._M_string_length + local_1698._M_string_length)
    goto LAB_0037879b;
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1878,0,0,local_1698._M_dataplus._M_p,local_1698._M_string_length);
  }
  else {
LAB_0037879b:
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1698,local_1878._M_dataplus._M_p,local_1878._M_string_length);
  }
  local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if (paVar2 == paVar14) {
    local_1678.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1678.field_2._8_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 8);
    local_1678.field_2._12_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 0xc);
  }
  else {
    local_1678.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1678._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1678._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_18f8._M_dataplus._M_p = (pointer)&local_18f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18f8,"getrawtransaction","");
  local_1918._M_dataplus._M_p = (pointer)&local_1918.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1918,"\"mytxid\" 2 \"myblockhash\"","");
  HelpExampleCli(&local_18d8,&local_18f8,&local_1918);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    uVar16 = local_1678.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_18d8._M_string_length + local_1678._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_18d8._M_dataplus._M_p != &local_18d8.field_2) {
      uVar16 = local_18d8.field_2._M_allocated_capacity;
    }
    if (local_18d8._M_string_length + local_1678._M_string_length <= (ulong)uVar16) {
      pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_18d8,0,0,local_1678._M_dataplus._M_p,local_1678._M_string_length);
      goto LAB_003788fc;
    }
  }
  pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_1678,local_18d8._M_dataplus._M_p,local_18d8._M_string_length);
LAB_003788fc:
  local_1658 = &local_1648;
  puVar3 = (ulong *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar14) {
    local_1648 = paVar14->_M_allocated_capacity;
    uStack_1640 = *(undefined8 *)((long)&pbVar12->field_2 + 8);
  }
  else {
    local_1648 = paVar14->_M_allocated_capacity;
    local_1658 = puVar3;
  }
  local_1630 = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  if (local_1658 == &local_1648) {
    uStack_1620 = uStack_1640;
    local_1638 = &local_1628;
  }
  else {
    local_1638 = local_1658;
  }
  local_1628 = local_1648;
  local_1650 = 0;
  local_1648 = local_1648 & 0xffffffffffffff00;
  pcVar20 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:328:9)>
            ::_M_manager;
  name_02._8_16_ = in_stack_ffffffffffffe3f0;
  name_02._M_dataplus._M_p = &stack0xffffffffffffe428;
  name_02.field_2._8_8_ = in_RDI;
  description_15.field_2._8_8_ = pRVar19;
  description_15._0_24_ = in_stack_ffffffffffffe408;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:328:9)>
                ::_M_manager;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe448._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe448._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:328:9)>
                ::_M_invoke;
  examples.m_examples._M_string_length = (size_type)in_stack_ffffffffffffe460;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe458;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar17;
  examples.m_examples.field_2._8_8_ = pRVar21;
  local_1658 = &local_1648;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_02,description_15,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar20 != (code *)0x0) {
    (*pcVar20)(&stack0xffffffffffffe428,&stack0xffffffffffffe428,3);
  }
  if (local_1638 != &local_1628) {
    operator_delete(local_1638,local_1628 + 1);
  }
  if (local_1658 != &local_1648) {
    operator_delete(local_1658,local_1648 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18d8._M_dataplus._M_p != &local_18d8.field_2) {
    operator_delete(local_18d8._M_dataplus._M_p,local_18d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1918._M_dataplus._M_p != &local_1918.field_2) {
    operator_delete(local_1918._M_dataplus._M_p,local_1918.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f8._M_dataplus._M_p != &local_18f8.field_2) {
    operator_delete(local_18f8._M_dataplus._M_p,local_18f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    operator_delete(local_1678._M_dataplus._M_p,local_1678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
    operator_delete(local_1878._M_dataplus._M_p,local_1878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18b8._M_dataplus._M_p != &local_18b8.field_2) {
    operator_delete(local_18b8._M_dataplus._M_p,local_18b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1898._M_dataplus._M_p != &local_1898.field_2) {
    operator_delete(local_1898._M_dataplus._M_p,local_1898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
    operator_delete(local_1698._M_dataplus._M_p,local_1698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1818._M_dataplus._M_p != &local_1818.field_2) {
    operator_delete(local_1818._M_dataplus._M_p,local_1818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1858._M_dataplus._M_p != &local_1858.field_2) {
    operator_delete(local_1858._M_dataplus._M_p,local_1858.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1838._M_dataplus._M_p != &local_1838.field_2) {
    operator_delete(local_1838._M_dataplus._M_p,local_1838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
    operator_delete(local_16b8._M_dataplus._M_p,local_16b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17b8._M_dataplus._M_p != &local_17b8.field_2) {
    operator_delete(local_17b8._M_dataplus._M_p,local_17b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
    operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d8._M_dataplus._M_p != &local_17d8.field_2) {
    operator_delete(local_17d8._M_dataplus._M_p,local_17d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
    operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
    operator_delete(local_1758._M_dataplus._M_p,local_1758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1798._M_dataplus._M_p != &local_1798.field_2) {
    operator_delete(local_1798._M_dataplus._M_p,local_1798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1778._M_dataplus._M_p != &local_1778.field_2) {
    operator_delete(local_1778._M_dataplus._M_p,local_1778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
    operator_delete(local_16f8._M_dataplus._M_p,local_16f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._M_dataplus._M_p != &local_1738.field_2) {
    operator_delete(local_1738._M_dataplus._M_p,local_1738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1718._M_dataplus._M_p != &local_1718.field_2) {
    operator_delete(local_1718._M_dataplus._M_p,local_1718.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1950);
  lVar15 = 0x198;
  do {
    if ((long *)((long)local_848 + lVar15) != *(long **)((long)local_858 + lVar15)) {
      operator_delete(*(long **)((long)local_858 + lVar15),*(long *)((long)local_848 + lVar15) + 1);
    }
    if ((long *)((long)local_868 + lVar15) != *(long **)((long)local_878 + lVar15)) {
      operator_delete(*(long **)((long)local_878 + lVar15),*(long *)((long)local_868 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar15));
    if ((long *)((long)local_8a8 + lVar15) != *(long **)((long)local_8b8 + lVar15)) {
      operator_delete(*(long **)((long)local_8b8 + lVar15),*(long *)((long)local_8a8 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1aa0);
  lVar15 = 0x198;
  do {
    if ((long *)(local_fd0 + lVar15) != *(long **)((long)local_fe0 + lVar15)) {
      operator_delete(*(long **)((long)local_fe0 + lVar15),*(long *)(local_fd0 + lVar15) + 1);
    }
    if ((long *)((long)local_ff0 + lVar15) != *(long **)((long)local_1000 + lVar15)) {
      operator_delete(*(long **)((long)local_1000 + lVar15),*(long *)((long)local_ff0 + lVar15) + 1)
      ;
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1020.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1030 + lVar15) != *(long **)((long)&local_1040 + lVar15)) {
      operator_delete(*(long **)((long)&local_1040 + lVar15),
                      *(long *)((long)local_1030 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1af0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1128.m_cond._M_dataplus._M_p != &local_1128.m_cond.field_2) {
    operator_delete(local_1128.m_cond._M_dataplus._M_p,
                    local_1128.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1128.m_description._M_dataplus._M_p != &local_1128.m_description.field_2) {
    operator_delete(local_1128.m_description._M_dataplus._M_p,
                    local_1128.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1128.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1128.m_key_name._M_dataplus._M_p != &local_1128.m_key_name.field_2) {
    operator_delete(local_1128.m_key_name._M_dataplus._M_p,
                    local_1128.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b08);
  lVar15 = 0x110;
  do {
    if ((long *)(local_1288 + lVar15) != *(long **)((long)local_1298 + lVar15)) {
      operator_delete(*(long **)((long)local_1298 + lVar15),*(long *)(local_1288 + lVar15) + 1);
    }
    if ((long *)((long)local_12a8 + lVar15) != *(long **)((long)local_12b8 + lVar15)) {
      operator_delete(*(long **)((long)local_12b8 + lVar15),*(long *)((long)local_12a8 + lVar15) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_12e8 + lVar15) != *(long **)((long)local_12f8 + lVar15)) {
      operator_delete(*(long **)((long)local_12f8 + lVar15),*(long *)((long)local_12e8 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe4c0);
  lVar15 = 0x220;
  do {
    if ((long *)(local_1528 + lVar15) != *(long **)((long)local_1538 + lVar15)) {
      operator_delete(*(long **)((long)local_1538 + lVar15),*(long *)(local_1528 + lVar15) + 1);
    }
    if ((long *)((long)local_1548 + lVar15) != *(long **)((long)local_1558 + lVar15)) {
      operator_delete(*(long **)((long)local_1558 + lVar15),*(long *)((long)local_1548 + lVar15) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1588 + lVar15) != *(long **)((long)local_1598 + lVar15)) {
      operator_delete(*(long **)((long)local_1598 + lVar15),*(long *)((long)local_1588 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe450);
  if (local_1618[0] != local_1608) {
    operator_delete(local_1618[0],local_1608[0] + 1);
  }
  if (local_15f8[0] != local_15e8) {
    operator_delete(local_15f8[0],local_15e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15d8._M_dataplus._M_p != &local_15d8.field_2) {
    operator_delete(local_15d8._M_dataplus._M_p,local_15d8.field_2._M_allocated_capacity + 1);
  }
  if (local_15b8[0] != local_15a8) {
    operator_delete(local_15b8[0],local_15a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe488);
  if (local_1598[0] != local_1588) {
    operator_delete(local_1598[0],local_1588[0] + 1);
  }
  if (local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1578.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe4a8);
  if (local_1558[0] != local_1548) {
    operator_delete(local_1558[0],local_1548[0] + 1);
  }
  if (local_1538[0] != (pointer)local_1528) {
    operator_delete(local_1538[0],local_1528._0_8_ + 1);
  }
  if (local_12f8[0] != local_12e8) {
    operator_delete(local_12f8[0],local_12e8[0] + 1);
  }
  if (local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_12d8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b28);
  if (local_12b8[0] != local_12a8) {
    operator_delete(local_12b8[0],local_12a8[0] + 1);
  }
  if (local_1298[0] != (pointer)local_1288) {
    operator_delete(local_1298[0],local_1288._0_8_ + 1);
  }
  if (local_1168[0] != local_1158) {
    operator_delete(local_1168[0],local_1158[0] + 1);
  }
  if (local_1148[0] != local_1138) {
    operator_delete(local_1148[0],local_1138[0] + 1);
  }
  if (local_10a0[0] != local_1090) {
    operator_delete(local_10a0[0],local_1090[0] + 1);
  }
  if (local_1080[0] != local_1070) {
    operator_delete(local_1080[0],local_1070[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ad8);
  if (local_1040 != local_1030) {
    operator_delete(local_1040,local_1030[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
    operator_delete(local_1060._M_dataplus._M_p,local_1060.field_2._M_allocated_capacity + 1);
  }
  if (local_1020.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1020.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1020.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1020.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ab8);
  if (local_1000[0] != local_ff0) {
    operator_delete(local_1000[0],local_ff0[0] + 1);
  }
  if (local_fe0[0] != (pointer)local_fd0) {
    operator_delete(local_fe0[0],local_fd0._0_8_ + 1);
  }
  if (local_e28[0] != local_e18) {
    operator_delete(local_e28[0],local_e18[0] + 1);
  }
  if (local_e08[0] != local_df8) {
    operator_delete(local_e08[0],local_df8[0] + 1);
  }
  if (local_de8[0] != local_dd8) {
    operator_delete(local_de8[0],local_dd8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1988);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8._M_dataplus._M_p != &local_dc8.field_2) {
    operator_delete(local_dc8._M_dataplus._M_p,local_dc8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19a8);
  lVar15 = 0x330;
  do {
    if ((long *)(local_c38 + lVar15) != *(long **)((long)local_c48 + lVar15)) {
      operator_delete(*(long **)((long)local_c48 + lVar15),*(long *)(local_c38 + lVar15) + 1);
    }
    if ((long *)((long)local_c58 + lVar15) != *(long **)((long)local_c68 + lVar15)) {
      operator_delete(*(long **)((long)local_c68 + lVar15),*(long *)((long)local_c58 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar15));
    if ((long *)((long)local_c98 + lVar15) != *(long **)((long)local_ca8 + lVar15)) {
      operator_delete(*(long **)((long)local_ca8 + lVar15),*(long *)((long)local_c98 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a68);
  if (local_da8[0] != local_d98) {
    operator_delete(local_da8[0],local_d98[0] + 1);
  }
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0],local_d78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a48);
  if (local_d68[0] != local_d58) {
    operator_delete(local_d68[0],local_d58[0] + 1);
  }
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0],local_d38[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
  }
  if (local_d08[0] != local_cf8) {
    operator_delete(local_d08[0],local_cf8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a08);
  if (local_ce8[0] != local_cd8) {
    operator_delete(local_ce8[0],local_cd8[0] + 1);
  }
  if (local_cc8[0] != local_cb8) {
    operator_delete(local_cc8[0],local_cb8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19e8);
  if (local_ca8[0] != local_c98) {
    operator_delete(local_ca8[0],local_c98[0] + 1);
  }
  if (local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_c88.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19c8);
  if (local_c68[0] != local_c58) {
    operator_delete(local_c68[0],local_c58[0] + 1);
  }
  if (local_c48[0] != (pointer)local_c38) {
    operator_delete(local_c48[0],local_c38._0_8_ + 1);
  }
  if (local_8f8[0] != local_8e8) {
    operator_delete(local_8f8[0],local_8e8[0] + 1);
  }
  if (local_8d8[0] != local_8c8) {
    operator_delete(local_8d8[0],local_8c8[0] + 1);
  }
  if (local_8b8[0] != local_8a8) {
    operator_delete(local_8b8[0],local_8a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1968);
  if (local_898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_898.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_878[0] != local_868) {
    operator_delete(local_878[0],local_868[0] + 1);
  }
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1930);
  lVar15 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar15));
    plVar4 = *(long **)((long)&local_410 + lVar15 + 0x40);
    plVar13 = (long *)((long)&local_410 + lVar15 + 0x50);
    if (plVar13 != plVar4) {
      operator_delete(plVar4,*plVar13 + 1);
    }
    plVar13 = (long *)((long)&local_410 + lVar15 + 0x28);
    plVar4 = *(long **)((long)&local_410 + lVar15 + 0x18);
    if (plVar13 != plVar4) {
      operator_delete(plVar4,*plVar13 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar15));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar15));
    if ((long *)((long)local_488 + lVar15) != *(long **)((long)local_498 + lVar15)) {
      operator_delete(*(long **)((long)local_498 + lVar15),*(long *)((long)local_488 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x108;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_678);
  if (local_698 != &local_688) {
    operator_delete(local_698,CONCAT71(uStack_687,local_688) + 1);
  }
  if (local_658[0] != local_648) {
    operator_delete(local_658[0],local_648[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_638._M_first);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_590);
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0,CONCAT71(uStack_59f,local_5a0) + 1);
  }
  if (local_570[0] != local_560) {
    operator_delete(local_570[0],local_560[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_550.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_550.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.val._M_dataplus._M_p != &local_550.val.field_2) {
    operator_delete(local_550.val._M_dataplus._M_p,
                    CONCAT71(local_550.val.field_2._M_allocated_capacity._1_7_,
                             local_550.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawtransaction()
{
    return RPCHelpMan{
                "getrawtransaction",

                "By default, this call only returns a transaction if it is in the mempool. If -txindex is enabled\n"
                "and no blockhash argument is passed, it will return the transaction if it is in the mempool or any block.\n"
                "If a blockhash argument is passed, it will return the transaction if\n"
                "the specified block is available and the transaction is in that block.\n\n"
                "Hint: Use gettransaction for wallet transactions.\n\n"

                "If verbosity is 0 or omitted, returns the serialized transaction as a hex-encoded string.\n"
                "If verbosity is 1, returns a JSON Object with information about the transaction.\n"
                "If verbosity is 2, returns a JSON Object with information about the transaction, including fee and prevout information.",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                    {"verbosity|verbose", RPCArg::Type::NUM, RPCArg::Default{0}, "0 for hex-encoded data, 1 for a JSON object, and 2 for JSON object with fee and prevout",
                     RPCArgOptions{.skip_type_check = true}},
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "The block in which to look for the transaction"},
                },
                {
                    RPCResult{"if verbosity is not set or set to 0",
                         RPCResult::Type::STR, "data", "The serialized transaction as a hex-encoded string for 'txid'"
                     },
                     RPCResult{"if verbosity is set to 1",
                         RPCResult::Type::OBJ, "", "",
                         Cat<std::vector<RPCResult>>(
                         {
                             {RPCResult::Type::BOOL, "in_active_chain", /*optional=*/true, "Whether specified block is in the active chain or not (only present with explicit \"blockhash\" argument)"},
                             {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "the block hash"},
                             {RPCResult::Type::NUM, "confirmations", /*optional=*/true, "The confirmations"},
                             {RPCResult::Type::NUM_TIME, "blocktime", /*optional=*/true, "The block time expressed in " + UNIX_EPOCH_TIME},
                             {RPCResult::Type::NUM, "time", /*optional=*/true, "Same as \"blocktime\""},
                             {RPCResult::Type::STR_HEX, "hex", "The serialized, hex-encoded data for 'txid'"},
                         },
                         DecodeTxDoc(/*txid_field_doc=*/"The transaction id (same as provided)")),
                    },
                    RPCResult{"for verbosity = 2",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                            {RPCResult::Type::NUM, "fee", /*optional=*/true, "transaction fee in " + CURRENCY_UNIT + ", omitted if block undo data is not available"},
                            {RPCResult::Type::ARR, "vin", "",
                            {
                                {RPCResult::Type::OBJ, "", "utxo being spent",
                                {
                                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                                    {RPCResult::Type::OBJ, "prevout", /*optional=*/true, "The previous output, omitted if block undo data is not available",
                                    {
                                        {RPCResult::Type::BOOL, "generated", "Coinbase or not"},
                                        {RPCResult::Type::NUM, "height", "The height of the prevout"},
                                        {RPCResult::Type::STR_AMOUNT, "value", "The value in " + CURRENCY_UNIT},
                                        {RPCResult::Type::OBJ, "scriptPubKey", "", ScriptPubKeyDoc()},
                                    }},
                                }},
                            }},
                        }},
                },
                RPCExamples{
                    HelpExampleCli("getrawtransaction", "\"mytxid\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 1")
            + HelpExampleRpc("getrawtransaction", "\"mytxid\", 1")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 0 \"myblockhash\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 1 \"myblockhash\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 2 \"myblockhash\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);

    uint256 hash = ParseHashV(request.params[0], "parameter 1");
    const CBlockIndex* blockindex = nullptr;

    if (hash == chainman.GetParams().GenesisBlock().hashMerkleRoot) {
        // Special exception for the genesis block coinbase transaction
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "The genesis block coinbase is not considered an ordinary transaction and cannot be retrieved");
    }

    // Accept either a bool (true) or a num (>=0) to indicate verbosity.
    int verbosity{0};
    if (!request.params[1].isNull()) {
        if (request.params[1].isBool()) {
            verbosity = request.params[1].get_bool();
        } else {
            verbosity = request.params[1].getInt<int>();
        }
    }

    if (!request.params[2].isNull()) {
        LOCK(cs_main);

        uint256 blockhash = ParseHashV(request.params[2], "parameter 3");
        blockindex = chainman.m_blockman.LookupBlockIndex(blockhash);
        if (!blockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block hash not found");
        }
    }

    bool f_txindex_ready = false;
    if (g_txindex && !blockindex) {
        f_txindex_ready = g_txindex->BlockUntilSyncedToCurrentChain();
    }

    uint256 hash_block;
    const CTransactionRef tx = GetTransaction(blockindex, node.mempool.get(), hash, hash_block, chainman.m_blockman);
    if (!tx) {
        std::string errmsg;
        if (blockindex) {
            const bool block_has_data = WITH_LOCK(::cs_main, return blockindex->nStatus & BLOCK_HAVE_DATA);
            if (!block_has_data) {
                throw JSONRPCError(RPC_MISC_ERROR, "Block not available");
            }
            errmsg = "No such transaction found in the provided block";
        } else if (!g_txindex) {
            errmsg = "No such mempool transaction. Use -txindex or provide a block hash to enable blockchain transaction queries";
        } else if (!f_txindex_ready) {
            errmsg = "No such mempool transaction. Blockchain transactions are still in the process of being indexed";
        } else {
            errmsg = "No such mempool or blockchain transaction";
        }
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, errmsg + ". Use gettransaction for wallet transactions.");
    }

    if (verbosity <= 0) {
        return EncodeHexTx(*tx);
    }

    UniValue result(UniValue::VOBJ);
    if (blockindex) {
        LOCK(cs_main);
        result.pushKV("in_active_chain", chainman.ActiveChain().Contains(blockindex));
    }
    // If request is verbosity >= 1 but no blockhash was given, then look up the blockindex
    if (request.params[2].isNull()) {
        LOCK(cs_main);
        blockindex = chainman.m_blockman.LookupBlockIndex(hash_block); // May be nullptr for mempool transactions
    }
    if (verbosity == 1) {
        TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate());
        return result;
    }

    CBlockUndo blockUndo;
    CBlock block;

    if (tx->IsCoinBase() || !blockindex || WITH_LOCK(::cs_main, return !(blockindex->nStatus & BLOCK_HAVE_MASK))) {
        TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate());
        return result;
    }
    if (!chainman.m_blockman.UndoReadFromDisk(blockUndo, *blockindex)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Undo data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
    }
    if (!chainman.m_blockman.ReadBlockFromDisk(block, *blockindex)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Block data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
    }

    CTxUndo* undoTX {nullptr};
    auto it = std::find_if(block.vtx.begin(), block.vtx.end(), [tx](CTransactionRef t){ return *t == *tx; });
    if (it != block.vtx.end()) {
        // -1 as blockundo does not have coinbase tx
        undoTX = &blockUndo.vtxundo.at(it - block.vtx.begin() - 1);
    }
    TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate(), undoTX, TxVerbosity::SHOW_DETAILS_AND_PREVOUT);
    return result;
},
    };
}